

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::is_chunked_transfer_encoding(Headers *headers)

{
  bool bVar1;
  char *__s;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Transfer-Encoding",&local_71);
  __s = get_header_value(headers,&local_30,"",0);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_72);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"chunked",&local_73);
  bVar1 = case_ignore::equal(&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

inline bool is_chunked_transfer_encoding(const Headers &headers) {
  return case_ignore::equal(
      get_header_value(headers, "Transfer-Encoding", "", 0), "chunked");
}